

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

void fix_rlimit(void)

{
  int iVar1;
  unsigned_long *in_RCX;
  char *msg;
  string_view_t fmt;
  rlimit limit;
  
  iVar1 = getrlimit(RLIMIT_NOFILE,(rlimit *)&limit);
  if (iVar1 == 0) {
    limit.rlim_cur = limit.rlim_max;
    iVar1 = setrlimit(RLIMIT_NOFILE,(rlimit *)&limit);
    if (iVar1 == 0) {
      fmt.size_ = (size_t)&limit;
      fmt.data_ = (char *)0x19;
      spdlog::debug<unsigned_long>((spdlog *)"RLIMIT_NOFILE updated: {}",fmt,in_RCX);
      return;
    }
    msg = "setrlimit() failed";
  }
  else {
    msg = "getrlimit() failed";
  }
  spdlog::warn<char[19]>((char (*) [19])msg);
  return;
}

Assistant:

void fix_rlimit() {
    struct rlimit limit;

    if (getrlimit(RLIMIT_NOFILE, &limit) != 0) {
        spdlog::warn("getrlimit() failed");
        return;
    }

    limit.rlim_cur = limit.rlim_max;
    if (setrlimit(RLIMIT_NOFILE, &limit) != 0) {
        spdlog::warn("setrlimit() failed");
        return;
    }

    spdlog::debug("RLIMIT_NOFILE updated: {}", limit.rlim_cur);
}